

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall
opengv::relative_pose::modules::Eigensolver_step::operator()
          (Eigensolver_step *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  ActualDstType actualDst;
  cayley_t cayley;
  Matrix<double,_1,_3,_1,_1,_3> jacobian;
  
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  cayley.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *pdVar1;
  cayley.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar1[1];
  cayley.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar1[2];
  eigensolver::getSmallestEVwithJacobian
            (this->_xxF,this->_yyF,this->_zzF,this->_xyF,this->_yzF,this->_zxF,&cayley,&jacobian);
  pdVar1 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  *pdVar1 = jacobian.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[0];
  pdVar1[1] = jacobian.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
              .array[1];
  pdVar1[2] = jacobian.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
              .array[2];
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
  {
    cayley_t cayley = x;
    Eigen::Matrix<double,1,3> jacobian;
    eigensolver::getSmallestEVwithJacobian(
        _xxF,_yyF,_zzF,_xyF,_yzF,_zxF,cayley,jacobian);

    fvec[0] = jacobian(0,0);
    fvec[1] = jacobian(0,1);
    fvec[2] = jacobian(0,2);
    return 0;
  }